

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O1

MainBuilder * __thiscall
kj::MainBuilder::expectZeroOrMoreArgs
          (MainBuilder *this,StringPtr title,
          Function<kj::MainBuilder::Validity_(kj::StringPtr)> *callback)

{
  RemoveConst<kj::MainBuilder::Impl::Arg> **ppRVar1;
  Impl *pIVar2;
  Disposer *pDVar3;
  Iface *pIVar4;
  Arg *pAVar5;
  Arg *pAVar6;
  RemoveConst<kj::MainBuilder::Impl::Arg> *pRVar7;
  size_t newSize;
  DebugExpression<bool> _kjCondition;
  Fault f;
  
  pIVar2 = (this->impl).ptr;
  _kjCondition.value = (pIVar2->subCommands)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
  if (_kjCondition.value) {
    pDVar3 = (callback->impl).disposer;
    pIVar4 = (callback->impl).ptr;
    (callback->impl).ptr = (Iface *)0x0;
    pAVar5 = (pIVar2->args).builder.endPtr;
    if ((pIVar2->args).builder.pos == pAVar5) {
      pAVar6 = (pIVar2->args).builder.ptr;
      newSize = 4;
      if (pAVar5 != pAVar6) {
        newSize = ((long)pAVar5 - (long)pAVar6 >> 3) * -0x6666666666666666;
      }
      Vector<kj::MainBuilder::Impl::Arg>::setCapacity(&pIVar2->args,newSize);
    }
    pRVar7 = (pIVar2->args).builder.pos;
    (pRVar7->title).content.ptr = title.content.ptr;
    (pRVar7->title).content.size_ = title.content.size_;
    (pRVar7->callback).impl.disposer = pDVar3;
    (pRVar7->callback).impl.ptr = pIVar4;
    pRVar7->minCount = 0;
    pRVar7->maxCount = 0xffffffff;
    ppRVar1 = &(pIVar2->args).builder.pos;
    *ppRVar1 = *ppRVar1 + 1;
    return this;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[50]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/main.c++"
             ,0x16d,FAILED,"impl->subCommands.empty()",
             "_kjCondition,\"cannot have sub-commands when expecting arguments\"",&_kjCondition,
             (char (*) [50])"cannot have sub-commands when expecting arguments");
  _::Debug::Fault::fatal(&f);
}

Assistant:

Validity printVersion() {
    context.exitInfo(version);
    return true;
  }